

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenu::timerEvent(QMenu *this,QTimerEvent *e)

{
  QMenuPrivate *this_00;
  QMenuScroller *pQVar1;
  TimerId TVar2;
  QMenu *pQVar3;
  
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  pQVar1 = this_00->scroll;
  if (pQVar1 == (QMenuScroller *)0x0) {
    TVar2 = *(TimerId *)(e + 0x10);
  }
  else {
    TVar2 = *(TimerId *)(e + 0x10);
    if ((pQVar1->scrollTimer).m_id == TVar2) {
      QMenuPrivate::scrollMenu(this_00,(uint)pQVar1->scrollDirection,false,false);
      if (this_00->scroll->scrollFlags != '\0') {
        return;
      }
      QBasicTimer::stop();
      return;
    }
  }
  if ((this_00->delayState).timer.m_id == TVar2) {
    if ((this_00->currentAction != (QAction *)0x0) &&
       (pQVar3 = QAction::menu<QMenu*>(this_00->currentAction), pQVar3 == (QMenu *)0x0)) {
      return;
    }
    QMenuPrivate::DelayState::stop(&this_00->delayState);
    QBasicTimer::stop();
    internalDelayedPopup(this);
    return;
  }
  if ((this_00->sloppyState).m_time.m_id == TVar2) {
    QMenuSloppyState::timeout(&this_00->sloppyState);
    return;
  }
  if ((this_00->searchBufferTimer).m_id != TVar2) {
    return;
  }
  QString::clear(&this_00->searchBuffer);
  return;
}

Assistant:

void
QMenu::timerEvent(QTimerEvent *e)
{
    Q_D(QMenu);
    if (d->scroll && d->scroll->scrollTimer.timerId() == e->timerId()) {
        d->scrollMenu((QMenuPrivate::QMenuScroller::ScrollDirection)d->scroll->scrollDirection);
        if (d->scroll->scrollFlags == QMenuPrivate::QMenuScroller::ScrollNone)
            d->scroll->scrollTimer.stop();
    } else if (d->delayState.timer.timerId() == e->timerId()) {
        if (d->currentAction && !d->currentAction->menu())
            return;
        d->delayState.stop();
        d->sloppyState.stopTimer();
        internalDelayedPopup();
    } else if (d->sloppyState.isTimerId(e->timerId())) {
        d->sloppyState.timeout();
    } else if (d->searchBufferTimer.timerId() == e->timerId()) {
        d->searchBuffer.clear();
    }
}